

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

bool __thiscall
cfgfile::generator::cfg::const_class_ptr_less::operator()
          (const_class_ptr_less *this,const_class_ptr_t *c1,const_class_ptr_t *c2)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar1 = (*c1)->m_line_number;
  lVar2 = (*c2)->m_line_number;
  bVar3 = true;
  if (lVar2 <= lVar1) {
    if (lVar1 != lVar2) {
      return false;
    }
    bVar3 = (*c1)->m_column_number < (*c2)->m_column_number;
  }
  return bVar3;
}

Assistant:

bool operator () ( const const_class_ptr_t & c1,
		const const_class_ptr_t & c2 )
	{
		if( c1->line_number() < c2->line_number() )
			return true;
		else if( c1->line_number() == c2->line_number() )
			return ( c1->column_number() < c2->column_number() );
		else
			return false;
	}